

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

bool __thiscall
GoState<9U,_9U>::is_alive
          (GoState<9U,_9U> *this,int i_start,int j_start,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *pieces)

{
  bool bVar1;
  reference pvVar2;
  iterator this_00;
  pair<int,_int> *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar3;
  int j;
  int i;
  value_type back;
  int player;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> stack;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  _Rb_tree_const_iterator<std::pair<int,_int>_> in_stack_ffffffffffffff20;
  pair<int,_int> *in_stack_ffffffffffffff28;
  pair<int,_int> in_stack_ffffffffffffff30;
  value_type *__x;
  uint local_68;
  uint local_64;
  _Self local_60;
  _Self local_58;
  value_type local_50;
  uint local_48;
  value_type local_38 [3];
  pair<int,_int> *local_20;
  int local_18;
  int local_14;
  byte local_1;
  
  if (*(char *)(in_RDI + 8 + (long)in_ESI * 9 + (long)in_EDX) == '\0') {
    local_1 = 1;
  }
  else {
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1b6445);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::clear((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *)0x1b6452);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,
               (int *)in_stack_ffffffffffffff20._M_node);
    local_48 = (uint)*(byte *)(in_RDI + 8 + (long)local_14 * 9 + (long)local_18);
    do {
      while( true ) {
        do {
          bVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             in_stack_ffffffffffffff30);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_1 = 0;
            goto LAB_001b6740;
          }
          __x = local_38;
          pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              in_stack_ffffffffffffff20._M_node);
          local_50 = *pvVar2;
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1b64d8)
          ;
          this_00 = std::
                    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                            *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20._M_node);
          local_58._M_node = this_00._M_node;
          local_60._M_node =
               (_Base_ptr)
               std::
               set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
          bVar1 = std::operator!=(&local_58,&local_60);
        } while (bVar1);
        std::tie<int,int>(&in_stack_ffffffffffffff28->first,(int *)in_stack_ffffffffffffff20._M_node
                         );
        std::tuple<int&,int&>::operator=
                  ((tuple<int_&,_int_&> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (*(byte *)(in_RDI + 8 + (long)(int)local_64 * 9 + (long)(int)local_68) != local_48)
        break;
        in_stack_ffffffffffffff28 = local_20;
        in_stack_ffffffffffffff30 =
             std::make_pair<int&,int&>
                       ((int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                        (int *)0x1b65db);
        pVar3 = std::
                set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                          *)this_00._M_node,__x);
        in_stack_ffffffffffffff20 = pVar3.first._M_node;
        in_stack_ffffffffffffff1f = pVar3.second;
        if (0 < (int)local_64) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,
                     (int *)in_stack_ffffffffffffff20._M_node);
        }
        if (local_64 < 8) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,
                     (int *)in_stack_ffffffffffffff20._M_node);
        }
        if (0 < (int)local_68) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,
                     (int *)in_stack_ffffffffffffff20._M_node);
        }
        if (local_68 < 8) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->first,
                     (int *)in_stack_ffffffffffffff20._M_node);
        }
      }
    } while (*(char *)(in_RDI + 8 + (long)(int)local_64 * 9 + (long)(int)local_68) != '\0');
    local_1 = 1;
LAB_001b6740:
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_ffffffffffffff30);
  }
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool is_alive(int i_start, int j_start, std::set<std::pair<int, int>>* pieces) const
	{
		if (board[i_start][j_start] == empty) {
			// No piece here, so alive
			return true;
		}

		std::vector<std::pair<int, int>> stack;
		pieces->clear();
		stack.emplace_back(i_start, j_start);
		int player = board[i_start][j_start];

		while (!stack.empty()) {
			auto back = stack.back();
			stack.pop_back();
			if (pieces->find(back) != pieces->end()) {
				// Already checked.
				continue;
			}
			int i,j;
			std::tie(i, j) = back;
			
			if (board[i][j] == player) {

				// Does not work in older GCC.
				//pieces->emplace(i, j);
				pieces->insert(std::make_pair(i, j));

				if (i > 0) {
					stack.emplace_back(i - 1, j);
				}
				if (i < M - 1) {
					stack.emplace_back(i + 1, j);
				}
				if (j > 0) {
					stack.emplace_back(i, j - 1);
				}
				if (j < N - 1) {
					stack.emplace_back(i, j + 1);
				}
			}
			else if (board[i][j] == empty) {
				// Alive.
				return true;
			}
		}
		return false;
	}